

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall
Chainstate::InvalidateBlock(Chainstate *this,BlockValidationState *state,CBlockIndex *pindex)

{
  set<CBlockIndex_*,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_> *this_00;
  int iVar1;
  pointer ppCVar2;
  ValidationSignals *pVVar3;
  Notifications *pNVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  CBlockIndex *pCVar10;
  iterator __position;
  CBlockIndex **ppCVar11;
  _Hash_node_base *p_Var12;
  RecursiveMutex *pmutexIn;
  ulong uVar13;
  DisconnectedBlockTransactions *this_01;
  _Base_ptr p_Var14;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<CBlockIndex_*>,_std::_Rb_tree_iterator<CBlockIndex_*>_> pVar15;
  CBlockIndex *invalid_walk_tip;
  CBlockIndex *to_mark_failed;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock28;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock27;
  DisconnectedBlockTransactions disconnectpool;
  multimap<const_arith_uint256,_CBlockIndex_*,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
  candidate_blocks_by_work;
  CBlockIndexWorkComparator local_119;
  CBlockIndex *local_118;
  CBlockIndex *local_110;
  unique_lock<std::recursive_mutex> local_108;
  undefined1 local_f8 [16];
  unique_lock<std::mutex> local_e8;
  DisconnectedBlockTransactions local_d8;
  _Rb_tree<const_arith_uint256,_std::pair<const_arith_uint256,_CBlockIndex_*>,_std::_Select1st<std::pair<const_arith_uint256,_CBlockIndex_*>_>,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindex == (CBlockIndex *)0x0) {
    __assert_fail("pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xe2d,"bool Chainstate::InvalidateBlock(BlockValidationState &, CBlockIndex *)");
  }
  if (pindex->nHeight == 0) {
    bVar5 = false;
  }
  else {
    local_e8._M_owns = false;
    local_110 = pindex;
    local_e8._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_e8);
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f8._0_8_ = &cs_main;
    local_f8[8] = false;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_f8);
    p_Var12 = (this->m_blockman->m_block_index)._M_h._M_before_begin._M_nxt;
    if (p_Var12 != (_Hash_node_base *)0x0) {
      do {
        pCVar10 = (CBlockIndex *)(p_Var12 + 5);
        iVar1 = *(int *)&p_Var12[8]._M_nxt;
        if ((((((long)iVar1 < 0) ||
              (ppCVar2 = (this->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_start,
              (int)((ulong)((long)(this->m_chain).vChain.
                                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3)
              <= iVar1)) || (ppCVar2[iVar1] != pCVar10)) &&
            ((bVar5 = ::node::CBlockIndexWorkComparator::operator()
                                ((CBlockIndexWorkComparator *)&local_d8,pCVar10,pindex->pprev),
             !bVar5 && (2 < (*(uint *)&p_Var12[0x10]._M_nxt & 7) &&
                        (*(uint *)&p_Var12[0x10]._M_nxt & 0x60) == 0)))) &&
           (p_Var12[0xf]._M_nxt != (_Hash_node_base *)0x0)) {
          local_d8.cachedInnerUsage = (uint64_t)p_Var12[10]._M_nxt;
          local_d8.m_max_mem_usage = (size_t)p_Var12[0xb]._M_nxt;
          local_d8.queuedTx.
          super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)p_Var12[0xc]._M_nxt;
          local_d8.queuedTx.
          super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)p_Var12[0xd]._M_nxt;
          local_d8.queuedTx.
          super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ._M_impl._M_node._M_size = (size_t)pCVar10;
          std::
          _Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
          ::_M_emplace_equal<std::pair<arith_uint256,CBlockIndex*>>
                    ((_Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
                      *)&local_68,(pair<arith_uint256,_CBlockIndex_*> *)&local_d8);
        }
        p_Var12 = p_Var12->_M_nxt;
      } while (p_Var12 != (_Hash_node_base *)0x0);
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)local_f8);
    this_00 = &this->setBlockIndexCandidates;
    uVar8 = 0;
    bVar6 = false;
    while (bVar5 = util::SignalInterrupt::operator_cast_to_bool(this->m_chainman->m_interrupt),
          !bVar5) {
      pVVar3 = (this->m_chainman->m_options).signals;
      if ((pVVar3 != (ValidationSignals *)0x0) &&
         (sVar9 = ValidationSignals::CallbacksPending(pVVar3), 10 < sVar9)) {
        ValidationSignals::SyncWithValidationInterfaceQueue(pVVar3);
      }
      local_f8._0_8_ = &cs_main;
      local_f8[8] = false;
      std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_f8);
      pmutexIn = &this->m_mempool->cs;
      if (this->m_mempool == (CTxMemPool *)0x0) {
        pmutexIn = (RecursiveMutex *)0x0;
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_108,pmutexIn,
                 "MempoolMutex()",
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                 ,0xe5e,false);
      iVar1 = pindex->nHeight;
      if (((long)iVar1 < 0) ||
         (ppCVar2 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
         (int)((ulong)((long)(this->m_chain).vChain.
                             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3) <=
         iVar1)) {
        pCVar10 = (CBlockIndex *)0x0;
      }
      else {
        pCVar10 = ppCVar2[iVar1];
      }
      if (pCVar10 != pindex) {
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)local_f8);
        break;
      }
      ppCVar2 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar2 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_118 = (CBlockIndex *)0x0;
      }
      else {
        local_118 = ppCVar2[-1];
      }
      DisconnectedBlockTransactions::DisconnectedBlockTransactions(&local_d8,20000000);
      bVar5 = DisconnectTip(this,state,&local_d8);
      MaybeUpdateMempoolForReorg(this,&local_d8,uVar8 < 10 && bVar5);
      if (!bVar5) {
        DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&local_d8);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
        this_01 = (DisconnectedBlockTransactions *)local_f8;
        goto LAB_00ae0298;
      }
      ppCVar2 = (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar2 ==
          (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        pCVar10 = (CBlockIndex *)0x0;
      }
      else {
        pCVar10 = ppCVar2[-1];
      }
      if (local_118->pprev != pCVar10) {
        __assert_fail("invalid_walk_tip->pprev == m_chain.Tip()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0xe6e,
                      "bool Chainstate::InvalidateBlock(BlockValidationState &, CBlockIndex *)");
      }
      *(byte *)&local_118->nStatus = (byte)local_118->nStatus | 0x20;
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&this->m_blockman->m_dirty_blockindex,&local_118);
      pVar15 = std::
               _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
               ::equal_range(&this_00->_M_t,&local_118);
      std::
      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node
                    );
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                  *)this_00,&local_118->pprev);
      pCVar10 = local_118->pprev;
      if ((pCVar10 == local_110) && ((local_110->nStatus & 0x20) != 0)) {
        local_110->nStatus = local_110->nStatus & 0xffffff9f | 0x40;
        std::
        _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
        ::_M_insert_unique<CBlockIndex*const&>
                  ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    *)&this->m_blockman->m_dirty_blockindex,&local_110);
        pCVar10 = local_118->pprev;
      }
      if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        __position._M_node = &local_68._M_impl.super__Rb_tree_header._M_header;
        p_Var14 = local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          uVar7 = base_uint<256U>::CompareTo
                            ((base_uint<256U> *)(p_Var14 + 1),
                             &(pCVar10->nChainWork).super_base_uint<256U>);
          if (-1 < (int)uVar7) {
            __position._M_node = p_Var14;
          }
          p_Var14 = (&p_Var14->_M_left)[uVar7 >> 0x1f];
        } while (p_Var14 != (_Base_ptr)0x0);
        while ((_Rb_tree_header *)__position._M_node != &local_68._M_impl.super__Rb_tree_header) {
          bVar5 = ::node::CBlockIndexWorkComparator::operator()
                            (&local_119,*(CBlockIndex **)(__position._M_node + 2),local_118->pprev);
          if (bVar5) {
            __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          }
          else {
            std::
            _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
            ::_M_insert_unique<CBlockIndex*const&>
                      ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                        *)this_00,(CBlockIndex **)(__position._M_node + 2));
            __position = std::
                         _Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
                         ::erase_abi_cxx11_((_Rb_tree<arith_uint256_const,std::pair<arith_uint256_const,CBlockIndex*>,std::_Select1st<std::pair<arith_uint256_const,CBlockIndex*>>,std::less<arith_uint256_const>,std::allocator<std::pair<arith_uint256_const,CBlockIndex*>>>
                                             *)&local_68,__position);
          }
        }
      }
      uVar8 = uVar8 + 1;
      local_110 = local_118;
      DisconnectedBlockTransactions::~DisconnectedBlockTransactions(&local_d8);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_108);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)local_f8);
      bVar6 = true;
    }
    ChainstateManager::CheckBlockIndex(this->m_chainman);
    local_d8.cachedInnerUsage = (uint64_t)&cs_main;
    local_d8.m_max_mem_usage = local_d8.m_max_mem_usage & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_d8);
    iVar1 = local_110->nHeight;
    if (((long)iVar1 < 0) ||
       (ppCVar2 = (this->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
       (int)((ulong)((long)(this->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)ppCVar2) >> 3) <= iVar1)) {
      pCVar10 = (CBlockIndex *)0x0;
    }
    else {
      pCVar10 = ppCVar2[iVar1];
    }
    if (pCVar10 == local_110) {
      this_01 = &local_d8;
LAB_00ae0298:
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)this_01);
      bVar5 = false;
    }
    else {
      *(byte *)&local_110->nStatus = (byte)local_110->nStatus | 0x20;
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&this->m_blockman->m_dirty_blockindex,&local_110);
      pVar15 = std::
               _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
               ::equal_range(&this_00->_M_t,&local_110);
      std::
      _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar15.first._M_node,(_Base_ptr)pVar15.second._M_node
                    );
      std::
      _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
      ::_M_insert_unique<CBlockIndex*const&>
                ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                  *)&this->m_chainman->m_failed_blocks,&local_110);
      p_Var12 = (this->m_blockman->m_block_index)._M_h._M_before_begin._M_nxt;
      if (p_Var12 != (_Hash_node_base *)0x0) {
        do {
          if ((2 < (*(uint *)&p_Var12[0x10]._M_nxt & 7) &&
               (*(uint *)&p_Var12[0x10]._M_nxt & 0x60) == 0) &&
             (p_Var12[0xf]._M_nxt != (_Hash_node_base *)0x0)) {
            ppCVar2 = (this->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if (ppCVar2 ==
                (this->m_chain).vChain.
                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                super__Vector_impl_data._M_start) {
              pCVar10 = (CBlockIndex *)0x0;
            }
            else {
              pCVar10 = ppCVar2[-1];
            }
            bVar5 = ::node::CBlockIndexWorkComparator::operator()
                              ((CBlockIndexWorkComparator *)local_f8,(CBlockIndex *)(p_Var12 + 5),
                               pCVar10);
            if (!bVar5) {
              local_f8._0_8_ = (CBlockIndex *)(p_Var12 + 5);
              std::
              _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
              ::_M_insert_unique<CBlockIndex*>
                        ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
                          *)this_00,(CBlockIndex **)local_f8);
            }
          }
          p_Var12 = p_Var12->_M_nxt;
        } while (p_Var12 != (_Hash_node_base *)0x0);
      }
      InvalidChainFound(this,local_110);
      std::unique_lock<std::recursive_mutex>::~unique_lock
                ((unique_lock<std::recursive_mutex> *)&local_d8);
      bVar5 = true;
      if (bVar6) {
        pNVar4 = (this->m_chainman->m_options).notifications;
        bVar6 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
        uVar13 = 2;
        if (bVar6) {
          uVar13 = (ulong)((this->m_chainman->m_blockman).m_blockfiles_indexed._M_base._M_i & 1);
        }
        (*pNVar4->_vptr_Notifications[2])(pNVar4,uVar13,local_110->pprev);
        pVVar3 = (this->m_chainman->m_options).signals;
        if (pVVar3 != (ValidationSignals *)0x0) {
          ppCVar2 = (this->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          if (ppCVar2 ==
              (this->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start) {
            local_d8.cachedInnerUsage = 0;
          }
          else {
            local_d8.cachedInnerUsage = (uint64_t)ppCVar2[-1];
          }
          ppCVar11 = inline_assertion_check<true,CBlockIndex*>
                               ((CBlockIndex **)&local_d8,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                ,0xebd,"InvalidateBlock","m_chain.Tip()");
          pCVar10 = *ppCVar11;
          bVar6 = ChainstateManager::IsInitialBlockDownload(this->m_chainman);
          ValidationSignals::ActiveTipChange(pVVar3,pCVar10,bVar6);
        }
      }
    }
    std::
    _Rb_tree<const_arith_uint256,_std::pair<const_arith_uint256,_CBlockIndex_*>,_std::_Select1st<std::pair<const_arith_uint256,_CBlockIndex_*>_>,_std::less<const_arith_uint256>,_std::allocator<std::pair<const_arith_uint256,_CBlockIndex_*>_>_>
    ::~_Rb_tree(&local_68);
    std::unique_lock<std::mutex>::~unique_lock(&local_e8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool Chainstate::InvalidateBlock(BlockValidationState& state, CBlockIndex* pindex)
{
    AssertLockNotHeld(m_chainstate_mutex);
    AssertLockNotHeld(::cs_main);

    // Genesis block can't be invalidated
    assert(pindex);
    if (pindex->nHeight == 0) return false;

    CBlockIndex* to_mark_failed = pindex;
    bool pindex_was_in_chain = false;
    int disconnected = 0;

    // We do not allow ActivateBestChain() to run while InvalidateBlock() is
    // running, as that could cause the tip to change while we disconnect
    // blocks.
    LOCK(m_chainstate_mutex);

    // We'll be acquiring and releasing cs_main below, to allow the validation
    // callbacks to run. However, we should keep the block index in a
    // consistent state as we disconnect blocks -- in particular we need to
    // add equal-work blocks to setBlockIndexCandidates as we disconnect.
    // To avoid walking the block index repeatedly in search of candidates,
    // build a map once so that we can look up candidate blocks by chain
    // work as we go.
    std::multimap<const arith_uint256, CBlockIndex *> candidate_blocks_by_work;

    {
        LOCK(cs_main);
        for (auto& entry : m_blockman.m_block_index) {
            CBlockIndex* candidate = &entry.second;
            // We don't need to put anything in our active chain into the
            // multimap, because those candidates will be found and considered
            // as we disconnect.
            // Instead, consider only non-active-chain blocks that have at
            // least as much work as where we expect the new tip to end up.
            if (!m_chain.Contains(candidate) &&
                    !CBlockIndexWorkComparator()(candidate, pindex->pprev) &&
                    candidate->IsValid(BLOCK_VALID_TRANSACTIONS) &&
                    candidate->HaveNumChainTxs()) {
                candidate_blocks_by_work.insert(std::make_pair(candidate->nChainWork, candidate));
            }
        }
    }

    // Disconnect (descendants of) pindex, and mark them invalid.
    while (true) {
        if (m_chainman.m_interrupt) break;

        // Make sure the queue of validation callbacks doesn't grow unboundedly.
        if (m_chainman.m_options.signals) LimitValidationInterfaceQueue(*m_chainman.m_options.signals);

        LOCK(cs_main);
        // Lock for as long as disconnectpool is in scope to make sure MaybeUpdateMempoolForReorg is
        // called after DisconnectTip without unlocking in between
        LOCK(MempoolMutex());
        if (!m_chain.Contains(pindex)) break;
        pindex_was_in_chain = true;
        CBlockIndex *invalid_walk_tip = m_chain.Tip();

        // ActivateBestChain considers blocks already in m_chain
        // unconditionally valid already, so force disconnect away from it.
        DisconnectedBlockTransactions disconnectpool{MAX_DISCONNECTED_TX_POOL_BYTES};
        bool ret = DisconnectTip(state, &disconnectpool);
        // DisconnectTip will add transactions to disconnectpool.
        // Adjust the mempool to be consistent with the new tip, adding
        // transactions back to the mempool if disconnecting was successful,
        // and we're not doing a very deep invalidation (in which case
        // keeping the mempool up to date is probably futile anyway).
        MaybeUpdateMempoolForReorg(disconnectpool, /* fAddToMempool = */ (++disconnected <= 10) && ret);
        if (!ret) return false;
        assert(invalid_walk_tip->pprev == m_chain.Tip());

        // We immediately mark the disconnected blocks as invalid.
        // This prevents a case where pruned nodes may fail to invalidateblock
        // and be left unable to start as they have no tip candidates (as there
        // are no blocks that meet the "have data and are not invalid per
        // nStatus" criteria for inclusion in setBlockIndexCandidates).
        invalid_walk_tip->nStatus |= BLOCK_FAILED_VALID;
        m_blockman.m_dirty_blockindex.insert(invalid_walk_tip);
        setBlockIndexCandidates.erase(invalid_walk_tip);
        setBlockIndexCandidates.insert(invalid_walk_tip->pprev);
        if (invalid_walk_tip->pprev == to_mark_failed && (to_mark_failed->nStatus & BLOCK_FAILED_VALID)) {
            // We only want to mark the last disconnected block as BLOCK_FAILED_VALID; its children
            // need to be BLOCK_FAILED_CHILD instead.
            to_mark_failed->nStatus = (to_mark_failed->nStatus ^ BLOCK_FAILED_VALID) | BLOCK_FAILED_CHILD;
            m_blockman.m_dirty_blockindex.insert(to_mark_failed);
        }

        // Add any equal or more work headers to setBlockIndexCandidates
        auto candidate_it = candidate_blocks_by_work.lower_bound(invalid_walk_tip->pprev->nChainWork);
        while (candidate_it != candidate_blocks_by_work.end()) {
            if (!CBlockIndexWorkComparator()(candidate_it->second, invalid_walk_tip->pprev)) {
                setBlockIndexCandidates.insert(candidate_it->second);
                candidate_it = candidate_blocks_by_work.erase(candidate_it);
            } else {
                ++candidate_it;
            }
        }

        // Track the last disconnected block, so we can correct its BLOCK_FAILED_CHILD status in future
        // iterations, or, if it's the last one, call InvalidChainFound on it.
        to_mark_failed = invalid_walk_tip;
    }

    m_chainman.CheckBlockIndex();

    {
        LOCK(cs_main);
        if (m_chain.Contains(to_mark_failed)) {
            // If the to-be-marked invalid block is in the active chain, something is interfering and we can't proceed.
            return false;
        }

        // Mark pindex (or the last disconnected block) as invalid, even when it never was in the main chain
        to_mark_failed->nStatus |= BLOCK_FAILED_VALID;
        m_blockman.m_dirty_blockindex.insert(to_mark_failed);
        setBlockIndexCandidates.erase(to_mark_failed);
        m_chainman.m_failed_blocks.insert(to_mark_failed);

        // If any new blocks somehow arrived while we were disconnecting
        // (above), then the pre-calculation of what should go into
        // setBlockIndexCandidates may have missed entries. This would
        // technically be an inconsistency in the block index, but if we clean
        // it up here, this should be an essentially unobservable error.
        // Loop back over all block index entries and add any missing entries
        // to setBlockIndexCandidates.
        for (auto& [_, block_index] : m_blockman.m_block_index) {
            if (block_index.IsValid(BLOCK_VALID_TRANSACTIONS) && block_index.HaveNumChainTxs() && !setBlockIndexCandidates.value_comp()(&block_index, m_chain.Tip())) {
                setBlockIndexCandidates.insert(&block_index);
            }
        }

        InvalidChainFound(to_mark_failed);
    }

    // Only notify about a new block tip if the active chain was modified.
    if (pindex_was_in_chain) {
        // Ignoring return value for now, this could be changed to bubble up
        // kernel::Interrupted value to the caller so the caller could
        // distinguish between completed and interrupted operations. It might
        // also make sense for the blockTip notification to have an enum
        // parameter indicating the source of the tip change so hooks can
        // distinguish user-initiated invalidateblock changes from other
        // changes.
        (void)m_chainman.GetNotifications().blockTip(GetSynchronizationState(m_chainman.IsInitialBlockDownload(), m_chainman.m_blockman.m_blockfiles_indexed), *to_mark_failed->pprev);

        // Fire ActiveTipChange now for the current chain tip to make sure clients are notified.
        // ActivateBestChain may call this as well, but not necessarily.
        if (m_chainman.m_options.signals) {
            m_chainman.m_options.signals->ActiveTipChange(*Assert(m_chain.Tip()), m_chainman.IsInitialBlockDownload());
        }
    }
    return true;
}